

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
::swap(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
       *this,btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *x,allocator_type *alloc)

{
  template_ElementType<1UL> tVar1;
  int iVar2;
  btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
  *this_00;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  template_ElementType<2UL> *ptVar9;
  template_ElementType<2UL> *ptVar10;
  template_ElementType<3UL> *ppbVar11;
  template_ElementType<3UL> *ppbVar12;
  template_ElementType<3UL> *__first2;
  template_ElementType<0UL> *ppbVar13;
  template_ElementType<1UL> *ptVar14;
  template_ElementType<1UL> *ptVar15;
  long lVar16;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *this_01;
  ulong uVar17;
  
  bVar3 = leaf(this);
  bVar4 = leaf(x);
  if (bVar3 != bVar4) {
    __assert_fail("leaf() == x->leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x942,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>]"
                 );
  }
  bVar5 = count(this);
  bVar6 = count(x);
  this_01 = x;
  this_00 = (btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
             *)this;
  if (bVar6 < bVar5) {
    this_01 = this;
    this_00 = (btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
               *)x;
  }
  ptVar9 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
           ::GetField<2ul>(this_00);
  ptVar10 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
            ::GetField<2ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                             *)this_01);
  bVar5 = count((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)this_00);
  for (lVar16 = 0; (ulong)bVar5 * 8 != lVar16; lVar16 = lVar16 + 8) {
    iVar2 = (ptVar9->value).first;
    (ptVar9->value).first = *(int *)((long)ptVar10 + lVar16);
    *(int *)((long)ptVar10 + lVar16) = iVar2;
    iVar2 = (ptVar9->value).second;
    (ptVar9->value).second = *(int *)((long)ptVar10 + lVar16 + 4);
    *(int *)((long)ptVar10 + lVar16 + 4) = iVar2;
    ptVar9 = ptVar9 + 1;
  }
  bVar5 = count(this_01);
  bVar6 = count((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)this_00);
  bVar7 = count((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)this_00);
  bVar8 = count((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)this_00);
  uninitialized_move_n
            (this_01,(ulong)bVar5 - (ulong)bVar6,(ulong)bVar7,(ulong)bVar8,
             (btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              *)this_00,alloc);
  bVar7 = count((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)this_00);
  value_destroy_n(this_01,(ulong)bVar7,(ulong)bVar5 - (ulong)bVar6,alloc);
  bVar3 = leaf(this);
  if (!bVar3) {
    ppbVar11 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
               ::GetField<3ul>(this_00);
    bVar5 = count((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                   *)this_00);
    ppbVar12 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
               ::GetField<3ul>(this_00);
    __first2 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
               ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                *)this_01);
    std::
    swap_ranges<phmap::priv::btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>**,phmap::priv::btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>**>
              (ppbVar11,ppbVar12 + (ulong)bVar5 + 1,__first2);
    for (uVar17 = 0;
        bVar5 = count((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                       *)this_00), uVar17 <= bVar5; uVar17 = uVar17 + 1) {
      ppbVar11 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                 ::GetField<3ul>(this_00);
      ppbVar13 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                 ::GetField<0ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                  *)ppbVar11[uVar17]);
      *ppbVar13 = (template_ElementType<0UL>)this_00;
      ppbVar11 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                 ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                  *)this_01);
      ppbVar13 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                 ::GetField<0ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                  *)ppbVar11[uVar17]);
      *ppbVar13 = this_01;
    }
    for (; bVar5 = count(this_01), uVar17 <= bVar5; uVar17 = uVar17 + 1) {
      ppbVar11 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                 ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                  *)this_01);
      init_child((btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                  *)this_00,(int)uVar17,ppbVar11[uVar17]);
      btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
      ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                       *)this_01);
    }
  }
  ptVar14 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                             *)this);
  ptVar15 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                             *)x);
  tVar1 = ptVar14[2];
  ptVar14[2] = ptVar15[2];
  ptVar15[2] = tVar1;
  return;
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
        using std::swap;
        assert(leaf() == x->leaf());

        // Determine which is the smaller/larger node.
        btree_node *smaller = this, *larger = x;
        if (smaller->count() > larger->count()) {
            swap(smaller, larger);
        }

        // Swap the values.
        for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
             a != end; ++a, ++b) {
            params_type::swap(alloc, a, b);
        }

        // Move values that can't be swapped.
        const size_type to_move = larger->count() - smaller->count();
        larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                                     smaller, alloc);
        larger->value_destroy_n(smaller->count(), to_move, alloc);

        if (!leaf()) {
            // Swap the child pointers.
            std::swap_ranges(&smaller->mutable_child(0),
                             &smaller->mutable_child(smaller->count() + 1),
                             &larger->mutable_child(0));
            // Update swapped children's parent pointers.
            int i = 0;
            for (; i <= smaller->count(); ++i) {
                smaller->child(i)->set_parent(smaller);
                larger->child(i)->set_parent(larger);
            }
            // Move the child pointers that couldn't be swapped.
            for (; i <= larger->count(); ++i) {
                smaller->init_child(i, larger->child(i));
                larger->clear_child(i);
            }
        }

        // Swap the counts.
        swap(mutable_count(), x->mutable_count());
    }